

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O0

int __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::clone
          (rt_unary_expr<viennamath::rt_expression_interface<double>_> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  int iVar2;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *this_00;
  element_type *peVar3;
  undefined4 extraout_var;
  element_type *peVar4;
  undefined4 extraout_var_00;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  this_00 = (rt_unary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x18);
  peVar3 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->expr_);
  iVar1 = (*peVar3->_vptr_rt_expression_interface[2])();
  peVar4 = std::auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>::
           operator->(&this->op_);
  iVar2 = (*peVar4->_vptr_op_interface[2])();
  rt_unary_expr(this_00,(rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1),
                (op_interface_type *)CONCAT44(extraout_var_00,iVar2));
  return (int)this_00;
}

Assistant:

InterfaceType * clone() const { return new rt_unary_expr(expr_->clone(), op_->clone()); }